

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_service_helpers(t_c_glib_generator *this,t_service *tservice)

{
  t_struct *ptVar1;
  t_program *program;
  t_type *type;
  t_field *elem;
  int iVar2;
  pointer pptVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string function_name;
  string arg_list_name_orig;
  t_field success;
  t_struct result;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_2a0;
  string local_288 [32];
  string local_268;
  string local_248 [32];
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  t_field local_1a8;
  t_struct local_f8;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_2a0,&tservice->functions_
            );
  for (pptVar3 = local_2a0._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_2a0._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    std::__cxx11::string::string(local_288,(string *)&(*pptVar3)->name_);
    ptVar1 = (*pptVar3)->arglist_;
    iVar2 = (*(ptVar1->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar1);
    std::__cxx11::string::string(local_248,(string *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)&local_1e8,local_288);
    underscores_to_initial_caps(&local_268,&local_1e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2),&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   "Args");
    (*(ptVar1->super_t_type).super_t_doc._vptr_t_doc[2])(ptVar1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1e8);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])(this,ptVar1);
    (*(ptVar1->super_t_type).super_t_doc._vptr_t_doc[2])(ptVar1,local_248);
    if ((*pptVar3)->oneway_ == false) {
      program = (this->super_t_oop_generator).super_t_generator.program_;
      iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&local_228,local_288);
      underscores_to_initial_caps(&local_208,&local_228);
      std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_01,iVar2),&local_208);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,&local_268,"Result");
      t_struct::t_struct(&local_f8,program,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      type = (*pptVar3)->returntype_;
      std::__cxx11::string::string((string *)&local_1c8,"success",(allocator *)&local_268);
      t_field::t_field(&local_1a8,type,&local_1c8,0);
      std::__cxx11::string::~string((string *)&local_1c8);
      local_1a8.req_ = T_OPTIONAL;
      iVar2 = (*((*pptVar3)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar2 == '\0') {
        t_struct::append(&local_f8,&local_1a8);
      }
      ptVar1 = (*pptVar3)->xceptions_;
      for (pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar4 !=
          (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
        elem = *pptVar4;
        elem->req_ = T_OPTIONAL;
        t_struct::append(&local_f8,elem);
      }
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x15])(this,&local_f8);
      t_field::~t_field(&local_1a8);
      t_struct::~t_struct(&local_f8);
    }
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_288);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_2a0);
  return;
}

Assistant:

void t_c_glib_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator function_iter;

  // Iterate through the service's methods
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    t_struct* arg_list = (*function_iter)->get_arglist();
    string arg_list_name_orig = arg_list->get_name();

    // Generate the arguments class
    arg_list->set_name(tservice->get_name() + underscores_to_initial_caps(function_name) + "Args");
    generate_struct(arg_list);

    arg_list->set_name(arg_list_name_orig);

    // Generate the result class
    if (!(*function_iter)->is_oneway()) {
      t_struct result(program_,
                      tservice->get_name() + underscores_to_initial_caps(function_name) + "Result");
      t_field success((*function_iter)->get_returntype(), "success", 0);
      success.set_req(t_field::T_OPTIONAL);
      if (!(*function_iter)->get_returntype()->is_void()) {
        result.append(&success);
      }

      t_struct* xs = (*function_iter)->get_xceptions();
      const vector<t_field*>& fields = xs->get_members();
      vector<t_field*>::const_iterator field_iter;
      for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
        (*field_iter)->set_req(t_field::T_OPTIONAL);
        result.append(*field_iter);
      }

      generate_struct(&result);
    }
  }
}